

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QByteArray,QtPrivate::QMetaTypeInterface_const*>::
emplace<QtPrivate::QMetaTypeInterface_const*const&>
          (QHash<QByteArray,QtPrivate::QMetaTypeInterface_const*> *this,QByteArray *key,
          QMetaTypeInterface **args)

{
  long in_FS_OFFSET;
  piter pVar1;
  QArrayDataPointer<char> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d = (key->d).d;
  local_30.ptr = (key->d).ptr;
  local_30.size = (key->d).size;
  if (local_30.d != (Data *)0x0) {
    LOCK();
    ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pVar1 = (piter)emplace<QtPrivate::QMetaTypeInterface_const*const&>
                           (this,(QByteArray *)&local_30,args);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }